

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Command.cpp
# Opt level: O1

void __thiscall IRCCommand::setAccessLevel(IRCCommand *this,string_view channel,int accessLevel)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ChannelAccessPair local_48;
  
  paVar1 = &local_48.channel.field_2;
  local_48.channel._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,channel._M_str,channel._M_str + channel._M_len);
  local_48.access = accessLevel;
  std::vector<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>::
  emplace_back<IRCCommand::ChannelAccessPair>(&this->m_channels,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.channel._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.channel._M_dataplus._M_p,
                    local_48.channel.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void IRCCommand::setAccessLevel(std::string_view channel, int accessLevel) {
	m_channels.push_back({ static_cast<std::string>(channel), accessLevel });
}